

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  
  if (((str == (char *)0x0) ||
      ((sVar5 = (size_t)(uint)len, len < 1 && (sVar5 = strlen(str), (int)sVar5 < 0)))) ||
     ((uVar8 = (uint)sVar5, pbVar6 = (byte *)target, target == (char *)0x0 &&
      (target = (char *)(*xmlMalloc)((size_t)sVar5 + 1), pbVar6 = (byte *)target,
      (byte *)target == (byte *)0x0)))) {
    pbVar6 = (byte *)0x0;
  }
  else {
    while (uVar8 != 0) {
      uVar8 = (uint)sVar5;
      bVar2 = *str;
      if (bVar2 == 0x25 && 2 < uVar8) {
        bVar3 = ((byte *)str)[1];
        bVar7 = bVar3 - 0x30;
        if ((9 < bVar7) && ((byte)((bVar3 & 0xdf) + 0xb9) < 0xfa)) goto LAB_00151ccd;
        bVar4 = ((byte *)str)[2];
        bVar1 = bVar4 - 0x30;
        if ((9 < bVar1) && ((byte)((bVar4 & 0xdf) + 0xb9) < 0xfa)) goto LAB_00151ccd;
        if (9 < bVar7) {
          if ((byte)(bVar3 + 0x9f) < 6) {
            bVar7 = bVar3 + 0xa9;
          }
          else {
            bVar7 = bVar3 - 0x37;
            if (5 < (byte)(bVar3 + 0xbf)) {
              bVar7 = 0;
            }
          }
        }
        if (bVar1 < 10) {
          bVar7 = bVar7 << 4 | bVar1;
        }
        else if ((byte)(bVar4 + 0x9f) < 6) {
          bVar7 = bVar4 + bVar7 * '\x10' + 0xa9;
        }
        else if ((byte)(bVar4 + 0xbf) < 6) {
          bVar7 = (bVar4 + bVar7 * '\x10') - 0x37;
        }
        str = (char *)((byte *)str + 3);
        uVar8 = uVar8 - 3;
        *target = bVar7;
      }
      else {
LAB_00151ccd:
        str = (char *)((byte *)str + 1);
        *target = bVar2;
        uVar8 = uVar8 - 1;
      }
      sVar5 = (size_t)uVar8;
      target = (char *)((byte *)target + 1);
    }
    *target = 0;
  }
  return (char *)pbVar6;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = xmlMalloc(len + 1);
	if (ret == NULL)
	    return(NULL);
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
            int c = 0;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = c * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = c * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = c * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
            /* Explicit sign change */
	    *out++ = (char) c;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}